

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableLazyMessageOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  variables = &(this->super_ImmutableLazyMessageFieldGenerator).super_ImmutableMessageFieldGenerator
               .variables_;
  io::Printer::Print(printer,variables,
                     "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n        $type$.getDefaultInstance());\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            ((ImmutableMessageFieldGenerator *)this,printer,
             "$deprecation$public Builder set$capitalized_name$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\nif (!($has_oneof_case_message$)) {\n  $oneof_name$_ = new $lazy_type$();\n  $set_oneof_case_message$;\n}\n(($lazy_type$) $oneof_name$_).setValue(value);\n$on_changed$\n"
             ,(char *)0x0,"return this;\n");
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            ((ImmutableMessageFieldGenerator *)this,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    $type$.Builder builderForValue)"
             ,
             "if (!($has_oneof_case_message$)) {\n  $oneof_name$_ = new $lazy_type$();\n  $set_oneof_case_message$;\n}\n(($lazy_type$) $oneof_name$_).setValue(builderForValue.build());\n$on_changed$\n"
             ,(char *)0x0,"return this;\n");
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            ((ImmutableMessageFieldGenerator *)this,printer,
             "$deprecation$public Builder merge$capitalized_name$($type$ value)",
             "if ($has_oneof_case_message$ &&\n    !(($lazy_type$) $oneof_name$_).containsDefaultInstance()) {\n  (($lazy_type$) $oneof_name$_).setValue(\n    $type$.newBuilder(\n        get$capitalized_name$()).mergeFrom(value).buildPartial());\n} else {\n  if (!($has_oneof_case_message$)) {\n    $oneof_name$_ = new $lazy_type$();\n    $set_oneof_case_message$;\n  }\n  (($lazy_type$) $oneof_name$_).setValue(value);\n}\n$on_changed$\n"
             ,(char *)0x0,"return this;\n");
  WriteFieldDocComment
            (printer,(this->super_ImmutableLazyMessageFieldGenerator).
                     super_ImmutableMessageFieldGenerator.descriptor_);
  ImmutableMessageFieldGenerator::PrintNestedBuilderFunction
            ((ImmutableMessageFieldGenerator *)this,printer,
             "$deprecation$public Builder clear$capitalized_name$()",
             "if ($has_oneof_case_message$) {\n  $clear_oneof_case_message$;\n  $oneof_name$_ = null;\n  $on_changed$\n}\n"
             ,(char *)0x0,"return this;\n");
  return;
}

Assistant:

void ImmutableLazyMessageOneofFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // boolean hasField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case_message$;\n"
    "}\n");

  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    return ($type$) (($lazy_type$) $oneof_name$_).getValue(\n"
    "        $type$.getDefaultInstance());\n"
    "  }\n"
    "  return $type$.getDefaultInstance();\n"
    "}\n");

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$($type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "if (!($has_oneof_case_message$)) {\n"
    "  $oneof_name$_ = new $lazy_type$();\n"
    "  $set_oneof_case_message$;\n"
    "}\n"
    "(($lazy_type$) $oneof_name$_).setValue(value);\n"
    "$on_changed$\n",

     NULL,  // Lazy fields are supported only for lite-runtime.

    "return this;\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    $type$.Builder builderForValue)",

    "if (!($has_oneof_case_message$)) {\n"
    "  $oneof_name$_ = new $lazy_type$();\n"
    "  $set_oneof_case_message$;\n"
    "}\n"
    "(($lazy_type$) $oneof_name$_).setValue(builderForValue.build());\n"
    "$on_changed$\n",

    NULL,

    "return this;\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder merge$capitalized_name$($type$ value)",

    "if ($has_oneof_case_message$ &&\n"
    "    !(($lazy_type$) $oneof_name$_).containsDefaultInstance()) {\n"
    "  (($lazy_type$) $oneof_name$_).setValue(\n"
    "    $type$.newBuilder(\n"
    "        get$capitalized_name$()).mergeFrom(value).buildPartial());\n"
    "} else {\n"
    "  if (!($has_oneof_case_message$)) {\n"
    "    $oneof_name$_ = new $lazy_type$();\n"
    "    $set_oneof_case_message$;\n"
    "  }\n"
    "  (($lazy_type$) $oneof_name$_).setValue(value);\n"
    "}\n"
    "$on_changed$\n",

    NULL,

    "return this;\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder clear$capitalized_name$()",

    "if ($has_oneof_case_message$) {\n"
    "  $clear_oneof_case_message$;\n"
    "  $oneof_name$_ = null;\n"
    "  $on_changed$\n"
    "}\n",

    NULL,

    "return this;\n");
}